

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ByteData256 *
cfd::CreateConfidentialTxSighash
          (ConfidentialTransactionContext *transaction,OutPoint *outpoint,UtxoData *utxo,
          SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,WitnessVersion version,
          ByteData *param_8,TaprootScriptTree *param_9)

{
  bool bVar1;
  long in_RCX;
  undefined8 in_RDX;
  ByteData *in_RSI;
  ByteData256 *in_RDI;
  SigHashType *in_R8;
  undefined8 in_R9;
  Script *in_stack_00000008;
  undefined4 in_stack_00000010;
  ByteData sig;
  ConfidentialValue value;
  undefined4 in_stack_fffffffffffffebc;
  ByteData *in_stack_fffffffffffffec0;
  SigHashType local_f4;
  undefined1 local_e8 [28];
  SigHashType local_cc;
  undefined1 local_c0 [24];
  ByteData local_a8;
  ConfidentialValue local_90;
  ConfidentialValue local_58;
  undefined8 local_30;
  SigHashType *local_28;
  long local_20;
  undefined8 local_18;
  ByteData *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::ConfidentialValue::ConfidentialValue(&local_58);
  bVar1 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)(local_20 + 0x490));
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue(&local_90,(Amount *)(local_20 + 600));
    core::ConfidentialValue::operator=(&local_58,&local_90);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x555a49);
  }
  else {
    core::ConfidentialValue::operator=(&local_58,(ConfidentialValue *)(local_20 + 0x490));
  }
  core::ByteData::ByteData(&local_a8);
  bVar1 = core::Script::IsEmpty(in_stack_00000008);
  if (bVar1) {
    core::SigHashType::SigHashType(&local_cc,local_28);
    (**(code **)((local_10->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start + 0xb0))
              (local_c0,local_10,local_18,local_30,&local_cc,&local_58);
    core::ByteData::operator=
              (in_stack_fffffffffffffec0,
               (ByteData *)CONCAT44(in_stack_fffffffffffffebc,in_stack_00000010));
    core::ByteData::~ByteData((ByteData *)0x555b76);
  }
  else {
    core::SigHashType::SigHashType(&local_f4,local_28);
    (**(code **)((local_10->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start + 0xb8))
              (local_e8,local_10,local_18,in_stack_00000008,&local_f4,&local_58);
    core::ByteData::operator=
              (local_10,(ByteData *)CONCAT44(in_stack_fffffffffffffebc,in_stack_00000010));
    core::ByteData::~ByteData((ByteData *)0x555c35);
  }
  core::ByteData256::ByteData256(in_RDI,&local_a8);
  core::ByteData::~ByteData((ByteData *)0x555c56);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x555c63);
  return in_RDI;
}

Assistant:

static ByteData256 CreateConfidentialTxSighash(
    const ConfidentialTransactionContext* transaction,
    const OutPoint& outpoint, const UtxoData& utxo,
    const SigHashType& sighash_type, const Pubkey& pubkey,
    const Script& redeem_script, WitnessVersion version, const ByteData*,
    const TaprootScriptTree*) {
  ConfidentialValue value;
  if (utxo.value_commitment.IsEmpty()) {
    value = ConfidentialValue(utxo.amount);
  } else {
    value = utxo.value_commitment;
  }
  ByteData sig;
  if (redeem_script.IsEmpty()) {
    sig = transaction->CreateSignatureHash(
        outpoint, pubkey, sighash_type, value, version);
  } else {
    sig = transaction->CreateSignatureHash(
        outpoint, redeem_script, sighash_type, value, version);
  }
  return ByteData256(sig);
}